

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTi.cpp
# Opt level: O1

void __thiscall OpenMD::NPTi::loadEta(NPTi *this)

{
  Mat3x3d etaMat;
  Mat3x3d local_58;
  
  Snapshot::getBarostat
            (&local_58,(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap);
  this->eta = local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
  return;
}

Assistant:

void NPTi::loadEta() {
    Mat3x3d etaMat = snap->getBarostat();
    eta            = etaMat(0, 0);
    // if (fabs(etaMat(1,1) - eta) >= OpenMD::epsilon || fabs(etaMat(1,1) - eta)
    // >= OpenMD::epsilon || !etaMat.isDiagonal()) {
    //    snprintf( painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
    //             "NPTi error: the diagonal elements of  eta matrix are not the
    //             same or etaMat is not a diagonal matrix");
    //    painCave.isFatal = 1;
    //    simError();
    //}
  }